

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_encode.c
# Opt level: O0

int cram_add_softclip(cram_container *c,cram_slice *s,cram_record *r,int pos,int len,char *base,
                     int version)

{
  size_t sVar1;
  int iVar2;
  uchar *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  int local_44;
  undefined1 local_40 [4];
  int i;
  cram_feature f;
  char *base_local;
  int len_local;
  int pos_local;
  cram_record *r_local;
  cram_slice *s_local;
  cram_container *c_local;
  
  local_40 = (undefined1  [4])(pos + 1);
  i = 0x53;
  f.field_0.X.pos = len;
  f.field_0._8_8_ = base;
  if (version >> 8 == 1) {
    f.field_0.X.code = (int)s->base_blk->byte;
    while (s->base_blk->alloc <= s->base_blk->byte + (long)len) {
      if (s->base_blk->alloc == 0) {
        local_50 = 1024.0;
      }
      else {
        sVar1 = s->base_blk->alloc;
        auVar4._8_4_ = (int)(sVar1 >> 0x20);
        auVar4._0_8_ = sVar1;
        auVar4._12_4_ = 0x45300000;
        local_50 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
      }
      s->base_blk->alloc =
           (long)local_50 | (long)(local_50 - 9.223372036854776e+18) & (long)local_50 >> 0x3f;
      puVar3 = (uchar *)realloc(s->base_blk->data,s->base_blk->alloc);
      s->base_blk->data = puVar3;
    }
    memcpy(s->base_blk->data + s->base_blk->byte,(void *)f.field_0._8_8_,(long)len);
    s->base_blk->byte = (long)len + s->base_blk->byte;
    while (s->base_blk->alloc <= s->base_blk->byte + 1) {
      if (s->base_blk->alloc == 0) {
        local_58 = 1024.0;
      }
      else {
        sVar1 = s->base_blk->alloc;
        auVar5._8_4_ = (int)(sVar1 >> 0x20);
        auVar5._0_8_ = sVar1;
        auVar5._12_4_ = 0x45300000;
        local_58 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
      }
      s->base_blk->alloc =
           (long)local_58 | (long)(local_58 - 9.223372036854776e+18) & (long)local_58 >> 0x3f;
      puVar3 = (uchar *)realloc(s->base_blk->data,s->base_blk->alloc);
      s->base_blk->data = puVar3;
    }
    puVar3 = s->base_blk->data;
    sVar1 = s->base_blk->byte;
    s->base_blk->byte = sVar1 + 1;
    puVar3[sVar1] = '\0';
  }
  else {
    f.field_0.X.code = (int)s->soft_blk->byte;
    if (base == (char *)0x0) {
      for (local_44 = 0; local_44 < len; local_44 = local_44 + 1) {
        while (s->soft_blk->alloc <= s->soft_blk->byte + 1) {
          if (s->soft_blk->alloc == 0) {
            local_68 = 1024.0;
          }
          else {
            sVar1 = s->soft_blk->alloc;
            auVar7._8_4_ = (int)(sVar1 >> 0x20);
            auVar7._0_8_ = sVar1;
            auVar7._12_4_ = 0x45300000;
            local_68 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
          }
          s->soft_blk->alloc =
               (long)local_68 | (long)(local_68 - 9.223372036854776e+18) & (long)local_68 >> 0x3f;
          puVar3 = (uchar *)realloc(s->soft_blk->data,s->soft_blk->alloc);
          s->soft_blk->data = puVar3;
        }
        puVar3 = s->soft_blk->data;
        sVar1 = s->soft_blk->byte;
        s->soft_blk->byte = sVar1 + 1;
        puVar3[sVar1] = 'N';
      }
    }
    else {
      while (s->soft_blk->alloc <= s->soft_blk->byte + (long)len) {
        if (s->soft_blk->alloc == 0) {
          local_60 = 1024.0;
        }
        else {
          sVar1 = s->soft_blk->alloc;
          auVar6._8_4_ = (int)(sVar1 >> 0x20);
          auVar6._0_8_ = sVar1;
          auVar6._12_4_ = 0x45300000;
          local_60 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
        }
        s->soft_blk->alloc =
             (long)local_60 | (long)(local_60 - 9.223372036854776e+18) & (long)local_60 >> 0x3f;
        puVar3 = (uchar *)realloc(s->soft_blk->data,s->soft_blk->alloc);
        s->soft_blk->data = puVar3;
      }
      memcpy(s->soft_blk->data + s->soft_blk->byte,(void *)f.field_0._8_8_,(long)len);
      s->soft_blk->byte = (long)len + s->soft_blk->byte;
    }
    while (s->soft_blk->alloc <= s->soft_blk->byte + 1) {
      if (s->soft_blk->alloc == 0) {
        local_70 = 1024.0;
      }
      else {
        sVar1 = s->soft_blk->alloc;
        auVar8._8_4_ = (int)(sVar1 >> 0x20);
        auVar8._0_8_ = sVar1;
        auVar8._12_4_ = 0x45300000;
        local_70 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
      }
      s->soft_blk->alloc =
           (long)local_70 | (long)(local_70 - 9.223372036854776e+18) & (long)local_70 >> 0x3f;
      puVar3 = (uchar *)realloc(s->soft_blk->data,s->soft_blk->alloc);
      s->soft_blk->data = puVar3;
    }
    puVar3 = s->soft_blk->data;
    sVar1 = s->soft_blk->byte;
    s->soft_blk->byte = sVar1 + 1;
    puVar3[sVar1] = '\0';
  }
  iVar2 = cram_add_feature(c,s,r,(cram_feature *)local_40);
  return iVar2;
}

Assistant:

static int cram_add_softclip(cram_container *c, cram_slice *s, cram_record *r,
			     int pos, int len, char *base, int version) {
    cram_feature f;
    f.S.pos = pos+1;
    f.S.code = 'S';
    f.S.len = len;
    switch (CRAM_MAJOR_VERS(version)) {
    case 1:
	f.S.seq_idx = BLOCK_SIZE(s->base_blk);
	BLOCK_APPEND(s->base_blk, base, len);
	BLOCK_APPEND_CHAR(s->base_blk, '\0');
	break;

    case 2:
    default:
	f.S.seq_idx = BLOCK_SIZE(s->soft_blk);
	if (base) {
	    BLOCK_APPEND(s->soft_blk, base, len);
	} else {
	    int i;
	    for (i = 0; i < len; i++)
		BLOCK_APPEND_CHAR(s->soft_blk, 'N');
	}
	BLOCK_APPEND_CHAR(s->soft_blk, '\0');
	break;

//    default:
//	// v3.0 onwards uses BB data-series
//	f.S.seq_idx = BLOCK_SIZE(s->soft_blk);
    }
    return cram_add_feature(c, s, r, &f);
}